

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_36f840::cURLProgressHelper::cURLProgressHelper
          (cURLProgressHelper *this,cmFileCommand *fc,char *text)

{
  char *text_local;
  cmFileCommand *fc_local;
  cURLProgressHelper *this_local;
  
  std::__cxx11::string::string((string *)&this->Text);
  this->CurrentPercentage = -1;
  this->FileCommand = fc;
  std::__cxx11::string::operator=((string *)&this->Text,text);
  return;
}

Assistant:

cURLProgressHelper(cmFileCommand* fc, const char* text)
  {
    this->CurrentPercentage = -1;
    this->FileCommand = fc;
    this->Text = text;
  }